

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraphTest.cpp
# Opt level: O2

void __thiscall DynamicGraphTest::testNonBreakDelete(DynamicGraphTest *this)

{
  DynamicGraph *this_00;
  uint __line;
  bool bVar1;
  unsigned_long uVar2;
  ostream *poVar3;
  char *__assertion;
  adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
  *in_R8;
  initializer_list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_> __l;
  allocator_type local_131;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_130;
  list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  expectedVirtualEdges;
  edge_desc_impl<boost::undirected_tag,_unsigned_long> local_f8;
  unsigned_long local_e0;
  unsigned_long uStack_d8;
  property_type *local_d0;
  unsigned_long local_c8;
  unsigned_long uStack_c0;
  property_type *local_b8;
  unsigned_long local_b0;
  unsigned_long uStack_a8;
  property_type *local_a0;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_90;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_70;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_50;
  
  this_00 = &this->G;
  local_f8.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source = 0x10;
  local_130.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source = 0x11;
  bVar1 = DynamicGraph::areConnected(this_00,(Vertex *)&local_f8,(Vertex *)&local_130);
  if (bVar1) {
    local_f8.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source = 0x10;
    local_130.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source = 0x11;
    DynamicGraph::deleteEdge(this_00,(Vertex *)&local_f8,(Vertex *)&local_130);
    local_f8.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source = 0x10;
    local_130.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source = 0x11;
    bVar1 = DynamicGraph::areConnected(this_00,(Vertex *)&local_f8,(Vertex *)&local_130);
    if (bVar1) {
      uVar2 = DynamicGraph::getLevel(this_00,0);
      if (uVar2 == 0) {
        uVar2 = DynamicGraph::getLevel(this_00,1);
        if (uVar2 == 1) {
          uVar2 = DynamicGraph::getLevel(this_00,2);
          if (uVar2 == 1) {
            uVar2 = DynamicGraph::getLevel(this_00,3);
            if (uVar2 == 2) {
              uVar2 = DynamicGraph::getLevel(this_00,4);
              if (uVar2 == 1) {
                uVar2 = DynamicGraph::getLevel(this_00,5);
                if (uVar2 == 2) {
                  uVar2 = DynamicGraph::getLevel(this_00,6);
                  if (uVar2 == 2) {
                    uVar2 = DynamicGraph::getLevel(this_00,7);
                    if (uVar2 == 1) {
                      uVar2 = DynamicGraph::getLevel(this_00,8);
                      if (uVar2 == 2) {
                        uVar2 = DynamicGraph::getLevel(this_00,9);
                        if (uVar2 == 1) {
                          uVar2 = DynamicGraph::getLevel(this_00,10);
                          if (uVar2 == 2) {
                            uVar2 = DynamicGraph::getLevel(this_00,0xb);
                            if (uVar2 == 2) {
                              uVar2 = DynamicGraph::getLevel(this_00,0xc);
                              if (uVar2 != 3) {
                                __assert_fail("G.getLevel(12)==3",
                                              "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                                              ,0x80,"void DynamicGraphTest::testNonBreakDelete()");
                              }
                              uVar2 = DynamicGraph::getLevel(this_00,0xd);
                              if (uVar2 != 3) {
                                __assert_fail("G.getLevel(13)==3",
                                              "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                                              ,0x81,"void DynamicGraphTest::testNonBreakDelete()");
                              }
                              uVar2 = DynamicGraph::getLevel(this_00,0xe);
                              if (uVar2 != 4) {
                                __assert_fail("G.getLevel(14)==4",
                                              "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                                              ,0x82,"void DynamicGraphTest::testNonBreakDelete()");
                              }
                              uVar2 = DynamicGraph::getLevel(this_00,0xf);
                              if (uVar2 != 3) {
                                __assert_fail("G.getLevel(15)==3",
                                              "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                                              ,0x83,"void DynamicGraphTest::testNonBreakDelete()");
                              }
                              uVar2 = DynamicGraph::getLevel(this_00,0x10);
                              if (uVar2 != 1) {
                                __assert_fail("G.getLevel(16)==1",
                                              "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                                              ,0x84,"void DynamicGraphTest::testNonBreakDelete()");
                              }
                              uVar2 = DynamicGraph::getLevel(this_00,0x11);
                              if (uVar2 != 4) {
                                __assert_fail("G.getLevel(17)==4",
                                              "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                                              ,0x85,"void DynamicGraphTest::testNonBreakDelete()");
                              }
                              uVar2 = DynamicGraph::getLevel(this_00,0x12);
                              if (uVar2 != 3) {
                                __assert_fail("G.getLevel(18)==3",
                                              "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                                              ,0x86,"void DynamicGraphTest::testNonBreakDelete()");
                              }
                              uVar2 = DynamicGraph::getLevel(this_00,0x13);
                              if (uVar2 != 2) {
                                __assert_fail("G.getLevel(19)==2",
                                              "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                                              ,0x87,"void DynamicGraphTest::testNonBreakDelete()");
                              }
                              uVar2 = DynamicGraph::getComponent(this_00,0);
                              if (uVar2 != 1) {
                                __assert_fail("G.getComponent(0)==1",
                                              "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                                              ,0x8a,"void DynamicGraphTest::testNonBreakDelete()");
                              }
                              uVar2 = DynamicGraph::getComponent(this_00,1);
                              if (uVar2 != 1) {
                                __assert_fail("G.getComponent(1)==1",
                                              "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                                              ,0x8b,"void DynamicGraphTest::testNonBreakDelete()");
                              }
                              uVar2 = DynamicGraph::getComponent(this_00,2);
                              if (uVar2 != 1) {
                                __assert_fail("G.getComponent(2)==1",
                                              "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                                              ,0x8c,"void DynamicGraphTest::testNonBreakDelete()");
                              }
                              uVar2 = DynamicGraph::getComponent(this_00,3);
                              if (uVar2 != 1) {
                                __assert_fail("G.getComponent(3)==1",
                                              "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                                              ,0x8d,"void DynamicGraphTest::testNonBreakDelete()");
                              }
                              uVar2 = DynamicGraph::getComponent(this_00,4);
                              if (uVar2 != 2) {
                                __assert_fail("G.getComponent(4)==2",
                                              "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                                              ,0x8e,"void DynamicGraphTest::testNonBreakDelete()");
                              }
                              uVar2 = DynamicGraph::getComponent(this_00,5);
                              if (uVar2 != 2) {
                                __assert_fail("G.getComponent(5)==2",
                                              "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                                              ,0x8f,"void DynamicGraphTest::testNonBreakDelete()");
                              }
                              uVar2 = DynamicGraph::getComponent(this_00,6);
                              if (uVar2 != 2) {
                                __assert_fail("G.getComponent(6)==2",
                                              "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                                              ,0x90,"void DynamicGraphTest::testNonBreakDelete()");
                              }
                              uVar2 = DynamicGraph::getComponent(this_00,9);
                              if (uVar2 == 4) {
                                uVar2 = DynamicGraph::getComponent(this_00,10);
                                if (uVar2 != 4) {
                                  __assert_fail("G.getComponent(10)==4",
                                                "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                                                ,0x92,"void DynamicGraphTest::testNonBreakDelete()")
                                  ;
                                }
                                uVar2 = DynamicGraph::getComponent(this_00,0xb);
                                if (uVar2 != 4) {
                                  __assert_fail("G.getComponent(11)==4",
                                                "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                                                ,0x93,"void DynamicGraphTest::testNonBreakDelete()")
                                  ;
                                }
                                uVar2 = DynamicGraph::getComponent(this_00,0xc);
                                if (uVar2 != 4) {
                                  __assert_fail("G.getComponent(12)==4",
                                                "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                                                ,0x94,"void DynamicGraphTest::testNonBreakDelete()")
                                  ;
                                }
                                uVar2 = DynamicGraph::getComponent(this_00,0xd);
                                if (uVar2 != 4) {
                                  __assert_fail("G.getComponent(13)==4",
                                                "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                                                ,0x95,"void DynamicGraphTest::testNonBreakDelete()")
                                  ;
                                }
                                uVar2 = DynamicGraph::getComponent(this_00,0xe);
                                if (uVar2 != 4) {
                                  __assert_fail("G.getComponent(14)==4",
                                                "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                                                ,0x96,"void DynamicGraphTest::testNonBreakDelete()")
                                  ;
                                }
                                uVar2 = DynamicGraph::getComponent(this_00,0xf);
                                if (uVar2 != 4) {
                                  __assert_fail("G.getComponent(15)==4",
                                                "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                                                ,0x97,"void DynamicGraphTest::testNonBreakDelete()")
                                  ;
                                }
                                uVar2 = DynamicGraph::getComponent(this_00,0x10);
                                if (uVar2 != 5) {
                                  __assert_fail("G.getComponent(16)==5",
                                                "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                                                ,0x98,"void DynamicGraphTest::testNonBreakDelete()")
                                  ;
                                }
                                uVar2 = DynamicGraph::getComponent(this_00,0x11);
                                if (uVar2 == 5) {
                                  uVar2 = DynamicGraph::getComponent(this_00,0x12);
                                  if (uVar2 != 5) {
                                    __assert_fail("G.getComponent(18)==5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                                                  ,0x9a,
                                                  "void DynamicGraphTest::testNonBreakDelete()");
                                  }
                                  uVar2 = DynamicGraph::getComponent(this_00,0x13);
                                  if (uVar2 == 5) {
                                    boost::
                                    edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                                              (&local_130,(boost *)0x0,4,(vertex_descriptor)this_00,
                                               in_R8);
                                    local_f8.m_eproperty = local_130.first.m_eproperty;
                                    local_f8.super_edge_base<boost::undirected_tag,_unsigned_long>.
                                    m_source = local_130.first.
                                               super_edge_base<boost::undirected_tag,_unsigned_long>
                                               .m_source;
                                    local_f8.super_edge_base<boost::undirected_tag,_unsigned_long>.
                                    m_target = local_130.first.
                                               super_edge_base<boost::undirected_tag,_unsigned_long>
                                               .m_target;
                                    boost::
                                    edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                                              (&local_50,(boost *)0x0,7,(vertex_descriptor)this_00,
                                               in_R8);
                                    local_d0 = local_50.first.m_eproperty;
                                    local_e0 = local_50.first.
                                               super_edge_base<boost::undirected_tag,_unsigned_long>
                                               .m_source;
                                    uStack_d8 = local_50.first.
                                                super_edge_base<boost::undirected_tag,_unsigned_long>
                                                .m_target;
                                    boost::
                                    edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                                              (&local_70,(boost *)0x0,9,(vertex_descriptor)this_00,
                                               in_R8);
                                    local_b8 = local_70.first.m_eproperty;
                                    local_c8 = local_70.first.
                                               super_edge_base<boost::undirected_tag,_unsigned_long>
                                               .m_source;
                                    uStack_c0 = local_70.first.
                                                super_edge_base<boost::undirected_tag,_unsigned_long>
                                                .m_target;
                                    boost::
                                    edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
                                              (&local_90,(boost *)0x0,0x10,
                                               (vertex_descriptor)this_00,in_R8);
                                    local_a0 = local_90.first.m_eproperty;
                                    local_b0 = local_90.first.
                                               super_edge_base<boost::undirected_tag,_unsigned_long>
                                               .m_source;
                                    uStack_a8 = local_90.first.
                                                super_edge_base<boost::undirected_tag,_unsigned_long>
                                                .m_target;
                                    __l._M_len = 4;
                                    __l._M_array = &local_f8;
                                    std::__cxx11::
                                    list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                                    ::list(&expectedVirtualEdges,__l,&local_131);
                                    testVirtualEdges(this,&expectedVirtualEdges);
                                    poVar3 = std::operator<<((ostream *)&std::cout,
                                                             "[+] test non break delete OK!");
                                    std::endl<char,std::char_traits<char>>(poVar3);
                                    std::__cxx11::
                                    _List_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                                    ::_M_clear(&expectedVirtualEdges.
                                                super__List_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
                                              );
                                    return;
                                  }
                                  __assert_fail("G.getComponent(19)==5",
                                                "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                                                ,0x9b,"void DynamicGraphTest::testNonBreakDelete()")
                                  ;
                                }
                                __assert_fail("G.getComponent(17)==5",
                                              "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                                              ,0x99,"void DynamicGraphTest::testNonBreakDelete()");
                              }
                              __assert_fail("G.getComponent(9)==4",
                                            "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                                            ,0x91,"void DynamicGraphTest::testNonBreakDelete()");
                            }
                            __assertion = "G.getLevel(11)==2";
                            __line = 0x7f;
                          }
                          else {
                            __assertion = "G.getLevel(10)==2";
                            __line = 0x7e;
                          }
                        }
                        else {
                          __assertion = "G.getLevel(9)==1";
                          __line = 0x7d;
                        }
                      }
                      else {
                        __assertion = "G.getLevel(8)==2";
                        __line = 0x7c;
                      }
                    }
                    else {
                      __assertion = "G.getLevel(7)==1";
                      __line = 0x7b;
                    }
                  }
                  else {
                    __assertion = "G.getLevel(6)==2";
                    __line = 0x7a;
                  }
                }
                else {
                  __assertion = "G.getLevel(5)==2";
                  __line = 0x79;
                }
              }
              else {
                __assertion = "G.getLevel(4)==1";
                __line = 0x78;
              }
            }
            else {
              __assertion = "G.getLevel(3)==2";
              __line = 0x77;
            }
          }
          else {
            __assertion = "G.getLevel(2)==1";
            __line = 0x76;
          }
        }
        else {
          __assertion = "G.getLevel(1)==1";
          __line = 0x75;
        }
      }
      else {
        __assertion = "G.getLevel(0)==0";
        __line = 0x74;
      }
    }
    else {
      __assertion = "G.areConnected(16, 17)";
      __line = 0x71;
    }
  }
  else {
    __assertion = "G.areConnected(16, 17)";
    __line = 0x6e;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/rafaelglikis[P]dynamic-connectivity/src/tests/DynamicGraphTest.cpp"
                ,__line,"void DynamicGraphTest::testNonBreakDelete()");
}

Assistant:

void DynamicGraphTest::testNonBreakDelete()
{
    assert(G.areConnected(16, 17));

    G.deleteEdge(16, 17);
    assert(G.areConnected(16, 17));

    // test levels
    assert(G.getLevel(0)==0);
    assert(G.getLevel(1)==1);
    assert(G.getLevel(2)==1);
    assert(G.getLevel(3)==2);
    assert(G.getLevel(4)==1);
    assert(G.getLevel(5)==2);
    assert(G.getLevel(6)==2);
    assert(G.getLevel(7)==1);
    assert(G.getLevel(8)==2);
    assert(G.getLevel(9)==1);
    assert(G.getLevel(10)==2);
    assert(G.getLevel(11)==2);
    assert(G.getLevel(12)==3);
    assert(G.getLevel(13)==3);
    assert(G.getLevel(14)==4);
    assert(G.getLevel(15)==3);
    assert(G.getLevel(16)==1);
    assert(G.getLevel(17)==4);
    assert(G.getLevel(18)==3);
    assert(G.getLevel(19)==2);

    // test components nothing changes
    assert(G.getComponent(0)==1);
    assert(G.getComponent(1)==1);
    assert(G.getComponent(2)==1);
    assert(G.getComponent(3)==1);
    assert(G.getComponent(4)==2);
    assert(G.getComponent(5)==2);
    assert(G.getComponent(6)==2);
    assert(G.getComponent(9)==4);
    assert(G.getComponent(10)==4);
    assert(G.getComponent(11)==4);
    assert(G.getComponent(12)==4);
    assert(G.getComponent(13)==4);
    assert(G.getComponent(14)==4);
    assert(G.getComponent(15)==4);
    assert(G.getComponent(16)==5);
    assert(G.getComponent(17)==5);
    assert(G.getComponent(18)==5);
    assert(G.getComponent(19)==5);

    // test virtual edges
    std::list<Edge> expectedVirtualEdges = {
            edge(0, 4, G).first,
            edge(0, 7, G).first,
            edge(0, 9, G).first,
            edge(0, 16, G).first,
    };
    testVirtualEdges(expectedVirtualEdges);


    std::cout << "[+] test non break delete OK!" << std::endl;
}